

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O2

uint32_t __thiscall RegistryValue::GetDword(RegistryValue *this)

{
  uint32_t uVar1;
  string *__return_storage_ptr__;
  
  if (this->m_dwType == 4) {
    if ((long)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start == 4) {
      uVar1 = BV_GetDword(&this->m_data);
      return uVar1;
    }
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"GetDword: incorrect size: %d",
               (long)(this->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
  else {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"GetDword: not a dword: %d",(ulong)this->m_dwType);
  }
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

uint32_t GetDword() const
    {
        if (m_dwType!=REG_DWORD) throw stringformat("GetDword: not a dword: %d", m_dwType);
        if (m_data.size()!=4) throw stringformat("GetDword: incorrect size: %d", m_data.size());

        return BV_GetDword(m_data);
    }